

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O0

AnimationCurveNodeList * __thiscall
Assimp::FBX::AnimationLayer::Nodes
          (AnimationCurveNodeList *__return_storage_ptr__,AnimationLayer *this,
          char **target_prop_whitelist,size_t whitelist_size)

{
  Document *this_00;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *this_01
  ;
  bool bVar1;
  int iVar2;
  uint64_t dest;
  size_type __n;
  reference ppCVar3;
  long lVar4;
  char *__s1;
  AnimationCurveNode *local_148;
  ulong local_f8;
  size_t i;
  bool ok;
  char *s;
  string local_d8;
  AnimationCurveNode *local_b8;
  AnimationCurveNode *anim;
  string local_a8;
  Object *local_88;
  Object *ob;
  Connection *con;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_50
  ;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *local_38;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *conns;
  size_t local_28;
  size_t whitelist_size_local;
  char **target_prop_whitelist_local;
  AnimationLayer *this_local;
  AnimationCurveNodeList *nodes;
  
  conns._7_1_ = 0;
  local_28 = whitelist_size;
  whitelist_size_local = (size_t)target_prop_whitelist;
  target_prop_whitelist_local = (char **)this;
  this_local = (AnimationLayer *)__return_storage_ptr__;
  std::
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  ::vector(__return_storage_ptr__);
  this_00 = this->doc;
  dest = FBX::Object::ID(&this->super_Object);
  Document::GetConnectionsByDestinationSequenced(&local_50,this_00,dest,"AnimationCurveNode");
  local_38 = &local_50;
  __n = std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        size(local_38);
  std::
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  ::reserve(__return_storage_ptr__,__n);
  this_01 = local_38;
  __end2 = std::
           vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           ::begin(local_38);
  con = (Connection *)
        std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        end(this_01);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                *)&con);
    if (!bVar1) {
      conns._7_1_ = 1;
      std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ::~vector(&local_50);
      if ((conns._7_1_ & 1) == 0) {
        std::
        vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
        ::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    ppCVar3 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              ::operator*(&__end2);
    ob = (Object *)*ppCVar3;
    Connection::PropertyName_abi_cxx11_((Connection *)ob);
    lVar4 = std::__cxx11::string::length();
    if (lVar4 == 0) {
      local_88 = Connection::SourceObject((Connection *)ob);
      if (local_88 == (Object *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,
                   "failed to read source object for AnimationCurveNode->AnimationLayer link, ignoring"
                   ,(allocator<char> *)((long)&anim + 7));
        Util::DOMWarning(&local_a8,(this->super_Object).element);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&anim + 7));
      }
      else {
        if (local_88 == (Object *)0x0) {
          local_148 = (AnimationCurveNode *)0x0;
        }
        else {
          local_148 = (AnimationCurveNode *)
                      __dynamic_cast(local_88,&FBX::Object::typeinfo,&AnimationCurveNode::typeinfo,0
                                    );
        }
        local_b8 = local_148;
        if (local_148 == (AnimationCurveNode *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,
                     "source object for ->AnimationLayer link is not an AnimationCurveNode",
                     (allocator<char> *)((long)&s + 7));
          Util::DOMWarning(&local_d8,(this->super_Object).element);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
        }
        else {
          if (whitelist_size_local != 0) {
            AnimationCurveNode::TargetProperty_abi_cxx11_(local_148);
            __s1 = (char *)std::__cxx11::string::c_str();
            bVar1 = false;
            for (local_f8 = 0; local_f8 < local_28; local_f8 = local_f8 + 1) {
              iVar2 = strcmp(__s1,*(char **)(whitelist_size_local + local_f8 * 8));
              if (iVar2 == 0) {
                bVar1 = true;
                break;
              }
            }
            if (!bVar1) goto LAB_00a3d3e9;
          }
          std::
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          ::push_back(__return_storage_ptr__,&local_b8);
        }
      }
    }
LAB_00a3d3e9:
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

AnimationCurveNodeList AnimationLayer::Nodes(const char* const * target_prop_whitelist /*= NULL*/,
    size_t whitelist_size /*= 0*/) const
{
    AnimationCurveNodeList nodes;

    // resolve attached animation nodes
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"AnimationCurveNode");
    nodes.reserve(conns.size());

    for(const Connection* con : conns) {

        // link should not go to a property
        if (con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for AnimationCurveNode->AnimationLayer link, ignoring",&element);
            continue;
        }

        const AnimationCurveNode* const anim = dynamic_cast<const AnimationCurveNode*>(ob);
        if(!anim) {
            DOMWarning("source object for ->AnimationLayer link is not an AnimationCurveNode",&element);
            continue;
        }

        if(target_prop_whitelist) {
            const char* s = anim->TargetProperty().c_str();
            bool ok = false;
            for (size_t i = 0; i < whitelist_size; ++i) {
                if (!strcmp(s, target_prop_whitelist[i])) {
                    ok = true;
                    break;
                }
            }
            if(!ok) {
                continue;
            }
        }
        nodes.push_back(anim);
    }

    return nodes; // pray for NRVO
}